

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstruct<std::complex<long_double>_>::TPZDohrSubstruct
          (TPZDohrSubstruct<std::complex<long_double>_> *this)

{
  TPZSavable *in_RDI;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> *in_stack_ffffffffffffff10;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> *in_stack_ffffffffffffff20;
  TPZMatrix<std::complex<long_double>_> *in_stack_ffffffffffffff28;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> *in_stack_ffffffffffffff30;
  TPZFMatrix<std::complex<long_double>_> *in_stack_ffffffffffffff40;
  TPZFMatrix<std::complex<long_double>_> *this_00;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> *in_stack_ffffffffffffff48;
  TPZSavable *pTVar1;
  TPZStepSolver<std::complex<long_double>_> *in_stack_ffffffffffffff50;
  TPZStepSolver<std::complex<long_double>_> *this_01;
  TPZManVector<std::complex<long_double>,_10> *this_02;
  
  TPZSavable::TPZSavable(in_RDI,&PTR_PTR_025ad5b8);
  in_RDI->_vptr_TPZSavable = (_func_int **)&PTR__TPZDohrSubstruct_025ad568;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(in_stack_ffffffffffffff40);
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(in_stack_ffffffffffffff40);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::TPZAutoPointer
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  TPZStepSolver<std::complex<long_double>_>::TPZStepSolver
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::~TPZAutoPointer(in_stack_ffffffffffffff10)
  ;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(in_stack_ffffffffffffff40);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x58));
  this_02 = (TPZManVector<std::complex<long_double>,_10> *)(in_RDI + 0x5c);
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(in_stack_ffffffffffffff40);
  pTVar1 = in_RDI + 0x6e;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(in_stack_ffffffffffffff40);
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(in_stack_ffffffffffffff40);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x92));
  TPZManVector<std::complex<long_double>,_10>::TPZManVector(this_02,(int64_t)pTVar1);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::TPZAutoPointer(in_stack_ffffffffffffff20);
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(in_stack_ffffffffffffff40);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0xd5));
  this_01 = (TPZStepSolver<std::complex<long_double>_> *)(in_RDI + 0xd9);
  TPZVec<std::pair<int,_int>_>::TPZVec((TPZVec<std::pair<int,_int>_> *)this_01);
  pTVar1 = in_RDI + 0xdd;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::TPZAutoPointer
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  TPZStepSolver<std::complex<long_double>_>::TPZStepSolver
            (this_01,(TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> *)pTVar1);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::~TPZAutoPointer(in_stack_ffffffffffffff10)
  ;
  this_00 = (TPZFMatrix<std::complex<long_double>_> *)(in_RDI + 0xfd);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::TPZAutoPointer
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  TPZStepSolver<std::complex<long_double>_>::TPZStepSolver
            (this_01,(TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> *)pTVar1);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::~TPZAutoPointer(in_stack_ffffffffffffff10)
  ;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::TPZAutoPointer
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  TPZStepSolver<std::complex<long_double>_>::TPZStepSolver
            (this_01,(TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> *)pTVar1);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::~TPZAutoPointer(in_stack_ffffffffffffff10)
  ;
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x13d));
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x141));
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(this_00);
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(this_00);
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(this_00);
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(this_00);
  return;
}

Assistant:

TPZDohrSubstruct<TVar>::TPZDohrSubstruct()
{
	//Inicializacao
}